

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.cpp
# Opt level: O3

void Shell::Shuffling::shuffle(Unit *unit)

{
  Clause *clause;
  undefined4 in_EDX;
  Shufflable sh;
  
  if ((unit->field_0x4 & 1) == 0) {
    clause = Kernel::Unit::asClause(unit);
    shuffle(clause);
    return;
  }
  sh._inner._0_8_ = *(ulong *)(unit + 1) >> 0x38;
  sh._inner._8_4_ = in_EDX;
  shuffleIter((Shuffling *)(*(ulong *)(unit + 1) << 8),sh);
  return;
}

Assistant:

void Shuffling::shuffle(Unit* unit)
{
  // cout << "Bef: " << unit->toString() << std::endl;

  if (unit->isClause()) {
    shuffle(unit->asClause());
  } else {
    shuffle(static_cast<FormulaUnit*>(unit)->formula());
  }

  // cout << "Aft: " << unit->toString() << std::endl;
}